

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImGuiColumns * ImGui::FindOrCreateColumns(ImGuiWindow *window,ImGuiID id)

{
  ImGuiColumnsFlags IVar1;
  int iVar2;
  ImGuiColumns *pIVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ImGuiColumns *pIVar8;
  byte bVar9;
  ImGuiColumns local_80;
  
  bVar9 = 0;
  lVar6 = (long)(window->ColumnsStorage).Size;
  if (0 < lVar6) {
    pIVar3 = (window->ColumnsStorage).Data;
    do {
      if (pIVar3->ID == id) {
        return pIVar3;
      }
      pIVar3 = pIVar3 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  ImGuiColumns::ImGuiColumns(&local_80);
  iVar2 = (window->ColumnsStorage).Size;
  if (iVar2 == (window->ColumnsStorage).Capacity) {
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    iVar7 = iVar2 + 1;
    if (iVar2 + 1 < iVar4) {
      iVar7 = iVar4;
    }
    pIVar3 = (ImGuiColumns *)MemAlloc((long)iVar7 * 0x60);
    pIVar8 = (window->ColumnsStorage).Data;
    if (pIVar8 != (ImGuiColumns *)0x0) {
      memcpy(pIVar3,pIVar8,(long)(window->ColumnsStorage).Size * 0x60);
      MemFree((window->ColumnsStorage).Data);
    }
    (window->ColumnsStorage).Data = pIVar3;
    (window->ColumnsStorage).Capacity = iVar7;
    iVar2 = (window->ColumnsStorage).Size;
  }
  else {
    pIVar3 = (window->ColumnsStorage).Data;
  }
  pIVar8 = &local_80;
  pIVar3 = pIVar3 + iVar2;
  for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
    IVar1 = pIVar8->Flags;
    pIVar3->ID = pIVar8->ID;
    pIVar3->Flags = IVar1;
    pIVar8 = (ImGuiColumns *)((long)pIVar8 + ((ulong)bVar9 * -2 + 1) * 8);
    pIVar3 = (ImGuiColumns *)((long)pIVar3 + (ulong)bVar9 * -0x10 + 8);
  }
  uVar5 = (window->ColumnsStorage).Size + 1;
  (window->ColumnsStorage).Size = uVar5;
  if (local_80.Columns.Data != (ImGuiColumnData *)0x0) {
    MemFree(local_80.Columns.Data);
    uVar5 = (window->ColumnsStorage).Size;
  }
  if (0 < (int)uVar5) {
    pIVar3 = (window->ColumnsStorage).Data + ((ulong)uVar5 - 1);
    pIVar3->ID = id;
    return pIVar3;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                ,0x50d,"T &ImVector<ImGuiColumns>::back() [T = ImGuiColumns]");
}

Assistant:

ImGuiColumns* ImGui::FindOrCreateColumns(ImGuiWindow* window, ImGuiID id)
{
    // We have few columns per window so for now we don't need bother much with turning this into a faster lookup.
    for (int n = 0; n < window->ColumnsStorage.Size; n++)
        if (window->ColumnsStorage[n].ID == id)
            return &window->ColumnsStorage[n];

    window->ColumnsStorage.push_back(ImGuiColumns());
    ImGuiColumns* columns = &window->ColumnsStorage.back();
    columns->ID = id;
    return columns;
}